

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

bool __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
try_prior(iterator *this)

{
  atomic<unsigned_long> aVar1;
  __atomic_base<unsigned_long> _Var2;
  bool bVar3;
  node_type type;
  stack_entry *psVar4;
  optimistic_lock *version_tag;
  atomic<long> *paVar5;
  version_type other;
  iter_result<unodb::detail::olc_node_header> *e_00;
  node_ptr node_00;
  node_ptr child;
  iter_result<unodb::detail::olc_node_header> *e2;
  iter_result_opt nxt;
  olc_inode<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode;
  undefined1 auStack_190 [3];
  node_type node_type;
  read_critical_section node_critical_section;
  node_ptr node;
  stack_entry *e;
  iterator *this_local;
  bool result_3;
  bool result;
  bool result_1;
  bool result_4;
  bool result_5;
  version_type local_d8;
  version_tag_type local_d0;
  byte local_c1;
  __atomic_base<unsigned_long> _Stack_c0;
  bool result_2;
  version_type local_b8;
  long local_b0;
  __int_type_conflict old_value_1;
  long local_a0;
  __int_type_conflict old_value;
  long local_90;
  memory_order local_88;
  int local_84;
  memory_order __b;
  long local_78;
  memory_order local_70;
  int local_6c;
  memory_order __b_1;
  undefined4 local_60;
  undefined4 local_5c;
  long local_58;
  undefined8 local_50;
  undefined4 local_44;
  undefined8 local_40;
  atomic<long> *local_38;
  long local_30;
  undefined8 local_28;
  undefined4 local_1c;
  undefined8 local_18;
  atomic<long> *local_10;
  
  do {
    bVar3 = empty(this);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      this_local._7_1_ = 1;
      break;
    }
    psVar4 = top(this);
    node_critical_section.version.version = (psVar4->super_iter_result).node.tagged_ptr;
    bVar3 = detail::basic_node_ptr<unodb::detail::olc_node_header>::operator==
                      ((basic_node_ptr<unodb::detail::olc_node_header> *)
                       &node_critical_section.version,(nullptr_t)0x0);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      __assert_fail("node != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                    ,0x8aa,
                    "bool unodb::olc_db<unsigned long, std::span<const std::byte>>::iterator::try_prior() [Key = unsigned long, Value = std::span<const std::byte>]"
                   );
    }
    version_tag = detail::node_ptr_lock((olc_node_ptr *)&node_critical_section.version);
    optimistic_lock::rehydrate_read_lock
              ((optimistic_lock *)auStack_190,(version_tag_type)version_tag);
    bVar3 = optimistic_lock::read_critical_section::check((read_critical_section *)auStack_190);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      type = detail::basic_node_ptr<unodb::detail::olc_node_header>::type
                       ((basic_node_ptr<unodb::detail::olc_node_header> *)
                        &node_critical_section.version);
      if (type == LEAF) {
        pop(this);
        _Var2._M_i = _auStack_190;
        aVar1.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_auStack_190;
        paVar5 = (atomic<long> *)(_auStack_190 + 8);
        local_84 = 2;
        _Stack_c0._M_i = (__int_type)aVar1.super___atomic_base<unsigned_long>._M_i;
        ___b = paVar5;
        local_88 = std::operator&(acquire,__memory_order_mask);
        if (local_84 - 1U < 2) {
          local_90 = (paVar5->super___atomic_base<long>)._M_i;
        }
        else if (local_84 == 5) {
          local_90 = (paVar5->super___atomic_base<long>)._M_i;
        }
        else {
          local_90 = (paVar5->super___atomic_base<long>)._M_i;
        }
        if (local_90 < 1) {
          __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                        ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
        }
        local_60 = 2;
        local_d0 = (version_tag_type)
                   optimistic_lock::atomic_version_type::load_relaxed
                             ((atomic_version_type *)_Var2._M_i);
        local_c1 = optimistic_lock::version_type::operator==(&local_b8,(version_type)local_d0);
        if (((local_c1 ^ 0xff) & 1) != 0) {
          optimistic_lock::dec_read_lock_count((optimistic_lock *)_Var2._M_i);
        }
        if ((local_c1 & 1) != 0) {
          local_38 = (atomic<long> *)(_Var2._M_i + 8);
          local_40 = 1;
          local_44 = 3;
          local_50 = 1;
          LOCK();
          local_a0 = (local_38->super___atomic_base<long>)._M_i;
          (local_38->super___atomic_base<long>)._M_i =
               (local_38->super___atomic_base<long>)._M_i + -1;
          UNLOCK();
          old_value = (__int_type_conflict)aVar1.super___atomic_base<unsigned_long>._M_i;
          local_58 = local_a0;
          if (local_a0 < 1) {
            __assert_fail("old_value > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                          ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
          }
        }
        _auStack_190 = 0;
        if (((local_c1 & 1 ^ 0xff) & 1) == 0) {
          inode._4_4_ = 2;
        }
        else {
          this_local._7_1_ = 0;
          inode._4_4_ = 1;
        }
      }
      else {
        nxt.
        super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
        _24_8_ = detail::basic_node_ptr<unodb::detail::olc_node_header>::
                 ptr<unodb::detail::olc_inode<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>*>
                           ((basic_node_ptr<unodb::detail::olc_node_header> *)
                            &node_critical_section.version);
        detail::
        basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
        ::prior((iter_result_opt *)&e2,
                (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                 *)nxt.
                   super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                   ._24_8_,type,(psVar4->super_iter_result).child_index);
        bVar3 = optimistic_lock::read_critical_section::check((read_critical_section *)auStack_190);
        if (((bVar3 ^ 0xffU) & 1) == 0) {
          bVar3 = std::optional::operator_cast_to_bool((optional *)&e2);
          if (bVar3) {
            bVar3 = std::optional::operator_cast_to_bool((optional *)&e2);
            if (!bVar3) {
              __assert_fail("nxt",
                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                            ,0x8c1,
                            "bool unodb::olc_db<unsigned long, std::span<const std::byte>>::iterator::try_prior() [Key = unsigned long, Value = std::span<const std::byte>]"
                           );
            }
            e_00 = std::optional<unodb::detail::iter_result<unodb::detail::olc_node_header>_>::value
                             ((optional<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                               *)&e2);
            pop(this);
            bVar3 = try_push(this,e_00,(read_critical_section *)auStack_190);
            if (((bVar3 ^ 0xffU) & 1) == 0) {
              node_00 = detail::
                        basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                        ::get_child((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                     *)nxt.
                                       super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                                       ._M_payload.
                                       super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                       ._24_8_,type,e_00->child_index);
              bVar3 = optimistic_lock::read_critical_section::check
                                ((read_critical_section *)auStack_190);
              if (((bVar3 ^ 0xffU) & 1) == 0) {
                this_local._7_1_ =
                     try_right_most_traversal
                               (this,(olc_node_ptr)node_00.tagged_ptr,
                                (read_critical_section *)auStack_190);
                inode._4_4_ = 1;
              }
              else {
                this_local._7_1_ = 0;
                inode._4_4_ = 1;
              }
            }
            else {
              this_local._7_1_ = 0;
              inode._4_4_ = 1;
            }
          }
          else {
            pop(this);
            _Var2._M_i = _auStack_190;
            aVar1.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_auStack_190;
            paVar5 = (atomic<long> *)(_auStack_190 + 8);
            local_6c = 2;
            ___b_1 = paVar5;
            local_70 = std::operator&(acquire,__memory_order_mask);
            if (local_6c - 1U < 2) {
              local_78 = (paVar5->super___atomic_base<long>)._M_i;
            }
            else if (local_6c == 5) {
              local_78 = (paVar5->super___atomic_base<long>)._M_i;
            }
            else {
              local_78 = (paVar5->super___atomic_base<long>)._M_i;
            }
            if (local_78 < 1) {
              __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                            ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
            }
            local_5c = 2;
            other = optimistic_lock::atomic_version_type::load_relaxed
                              ((atomic_version_type *)_Var2._M_i);
            bVar3 = optimistic_lock::version_type::operator==(&local_d8,other);
            if (((bVar3 ^ 0xffU) & 1) != 0) {
              optimistic_lock::dec_read_lock_count((optimistic_lock *)_Var2._M_i);
            }
            if (bVar3) {
              local_10 = (atomic<long> *)(_Var2._M_i + 8);
              local_18 = 1;
              local_1c = 3;
              local_28 = 1;
              LOCK();
              local_b0 = (local_10->super___atomic_base<long>)._M_i;
              (local_10->super___atomic_base<long>)._M_i =
                   (local_10->super___atomic_base<long>)._M_i + -1;
              UNLOCK();
              old_value_1 = (__int_type_conflict)aVar1.super___atomic_base<unsigned_long>._M_i;
              local_30 = local_b0;
              if (local_b0 < 1) {
                __assert_fail("old_value > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                              ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
              }
            }
            _auStack_190 = 0;
            if (((bVar3 ^ 0xffU) & 1) == 0) {
              inode._4_4_ = 2;
            }
            else {
              this_local._7_1_ = 0;
              inode._4_4_ = 1;
            }
          }
        }
        else {
          this_local._7_1_ = 0;
          inode._4_4_ = 1;
        }
      }
    }
    else {
      this_local._7_1_ = 0;
      inode._4_4_ = 1;
    }
    optimistic_lock::read_critical_section::~read_critical_section
              ((read_critical_section *)auStack_190);
  } while (inode._4_4_ != 1);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool olc_db<Key, Value>::iterator::try_prior() {
  while (!empty()) {
    const auto& e = top();
    const auto node{e.node};  // the node on the top of the stack.
    UNODB_DETAIL_ASSERT(node != nullptr);
    auto node_critical_section(
        node_ptr_lock(node).rehydrate_read_lock(e.version));
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check()))
      return false;  // LCOV_EXCL_LINE
    const auto node_type = node.type();
    if (node_type == node_type::LEAF) {
      pop();  // pop off the leaf
      if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
        return false;  // LCOV_EXCL_LINE
      continue;  // falls through loop if just a root leaf since stack now empty
    }
    auto* inode{node.template ptr<inode_type*>()};
    auto nxt = inode->prior(node_type, e.child_index);  // prev child of parent
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check()))
      return false;  // LCOV_EXCL_LINE
    if (!nxt) {
      pop();  // Nothing more for that inode.
      if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
        return false;  // LCOV_EXCL_LINE
      continue;        // We will look for the left sibling of the parent inode.
    }
    // Fix up stack for new parent node state and right-most descent.
    UNODB_DETAIL_ASSERT(nxt);  // value exists for std::optional.
    const auto& e2 = nxt.value();
    pop();
    if (UNODB_DETAIL_UNLIKELY(!try_push(e2, node_critical_section)))
      return false;                                            // LCOV_EXCL_LINE
    auto child = inode->get_child(node_type, e2.child_index);  // get child
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check()))  // before using
      return false;  // LCOV_EXCL_LINE
    return try_right_most_traversal(child, node_critical_section);
  }
  return true;  // stack is empty, so iterator == end().
}